

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  byte bVar6;
  bool bVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined1 auVar13 [32];
  long lVar14;
  long lVar15;
  unsigned_long uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar40 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar73;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar74;
  undefined1 auVar75 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar76;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar77;
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined4 uVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  size_t local_1b0;
  size_t local_1a8;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar18 = r->_begin;
  uVar16 = r->_end;
  if (uVar18 < uVar16) {
    auVar38._8_4_ = 0xff800000;
    auVar38._0_8_ = 0xff800000ff800000;
    auVar38._12_4_ = 0xff800000;
    auVar69 = ZEXT1664(auVar38);
    auVar39._8_4_ = 0x7f800000;
    auVar39._0_8_ = 0x7f8000007f800000;
    auVar39._12_4_ = 0x7f800000;
    auVar70 = ZEXT1664(auVar39);
    auVar72._8_4_ = 0x7fffffff;
    auVar72._0_8_ = 0x7fffffff7fffffff;
    auVar72._12_4_ = 0x7fffffff;
    auVar79._8_4_ = 0xddccb9a2;
    auVar79._0_8_ = 0xddccb9a2ddccb9a2;
    auVar79._12_4_ = 0xddccb9a2;
    auVar80._8_4_ = 0x5dccb9a2;
    auVar80._0_8_ = 0x5dccb9a25dccb9a2;
    auVar80._12_4_ = 0x5dccb9a2;
    local_1b0 = 0;
    auVar82 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    auVar40 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar86 = ZEXT3264(auVar40);
    auVar71 = ZEXT3264(CONCAT428(0x7fffffff,
                                 CONCAT424(0x7fffffff,
                                           CONCAT420(0x7fffffff,
                                                     CONCAT416(0x7fffffff,
                                                               CONCAT412(0x7fffffff,
                                                                         CONCAT48(0x7fffffff,
                                                                                  0x7fffffff7fffffff
                                                                                 )))))));
    auVar75 = ZEXT1664(auVar39);
    auVar78 = ZEXT1664(auVar38);
    local_1a8 = k;
    do {
      pBVar3 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
               vertices.items;
      uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar18);
      uVar20 = (ulong)(uVar2 + 3);
      if (uVar20 < (pBVar3->super_RawBufferView).num) {
        lVar17 = 0;
        do {
          lVar21 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar17);
          lVar22 = *(long *)((long)&(pBVar3->super_RawBufferView).stride + lVar17);
          lVar19 = lVar22 * (ulong)uVar2;
          auVar38 = vandps_avx(ZEXT416(*(uint *)(lVar21 + 0xc + lVar19)),auVar72);
          if (1.844e+18 <= auVar38._0_4_) goto LAB_01ecae64;
          lVar14 = lVar22 * (ulong)(uVar2 + 1);
          auVar38 = vandps_avx(ZEXT416(*(uint *)(lVar21 + 0xc + lVar14)),auVar72);
          if (1.844e+18 <= auVar38._0_4_) goto LAB_01ecae64;
          lVar15 = lVar22 * (ulong)(uVar2 + 2);
          auVar38 = vandps_avx(ZEXT416(*(uint *)(lVar21 + 0xc + lVar15)),auVar72);
          if (1.844e+18 <= auVar38._0_4_) goto LAB_01ecae64;
          auVar38 = vandps_avx(ZEXT416(*(uint *)(lVar21 + 0xc + lVar22 * uVar20)),auVar72);
          if (1.844e+18 <= auVar38._0_4_) goto LAB_01ecae64;
          auVar38 = *(undefined1 (*) [16])(lVar21 + lVar19);
          uVar10 = vcmpps_avx512vl(auVar38,auVar79,6);
          uVar11 = vcmpps_avx512vl(auVar38,auVar80,1);
          if ((~((ushort)uVar10 & (ushort)uVar11) & 7) != 0) goto LAB_01ecae64;
          auVar38 = *(undefined1 (*) [16])(lVar21 + lVar14);
          uVar10 = vcmpps_avx512vl(auVar38,auVar79,6);
          uVar11 = vcmpps_avx512vl(auVar38,auVar80,1);
          if ((~((ushort)uVar10 & (ushort)uVar11) & 7) != 0) goto LAB_01ecae64;
          auVar38 = *(undefined1 (*) [16])(lVar21 + lVar15);
          uVar10 = vcmpps_avx512vl(auVar38,auVar79,6);
          uVar11 = vcmpps_avx512vl(auVar38,auVar80,1);
          if ((~((ushort)uVar10 & (ushort)uVar11) & 7) != 0) goto LAB_01ecae64;
          auVar38 = *(undefined1 (*) [16])(lVar21 + lVar22 * uVar20);
          uVar10 = vcmpps_avx512vl(auVar38,auVar79,6);
          uVar11 = vcmpps_avx512vl(auVar38,auVar80,1);
          if ((~((ushort)uVar10 & (ushort)uVar11) & 7) != 0) goto LAB_01ecae64;
          lVar17 = lVar17 + 0x38;
        } while ((ulong)((this->super_CurveGeometryInterface<embree::BezierCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1) * 0x38 + 0x38 !=
                 lVar17);
        pcVar4 = (pBVar3->super_RawBufferView).ptr_ofs;
        sVar5 = (pBVar3->super_RawBufferView).stride;
        lVar17 = uVar2 * sVar5;
        auVar38 = *(undefined1 (*) [16])(pcVar4 + lVar17);
        lVar21 = (uVar2 + 1) * sVar5;
        auVar39 = *(undefined1 (*) [16])(pcVar4 + lVar21);
        lVar22 = (uVar2 + 2) * sVar5;
        auVar37 = *(undefined1 (*) [16])(pcVar4 + lVar22);
        auVar84 = *(undefined1 (*) [16])(pcVar4 + uVar20 * sVar5);
        fVar1 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                maxRadiusScale;
        auVar24 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar4 + lVar17 + 0xc)));
        auVar25 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar4 + lVar21 + 0xc)));
        auVar26 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar4 + lVar22 + 0xc)));
        auVar27 = vmulss_avx512f(ZEXT416((uint)fVar1),
                                 ZEXT416(*(uint *)(pcVar4 + uVar20 * sVar5 + 0xc)));
        uVar2 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                tessellationRate;
        uVar20 = (ulong)uVar2;
        uVar83 = auVar37._0_4_;
        if (uVar20 == 4) {
          auVar28 = vbroadcastss_avx512vl(auVar38);
          auVar29 = vshufps_avx512vl(auVar38,auVar38,0x55);
          auVar30 = vshufps_avx512vl(auVar38,auVar38,0xaa);
          auVar24 = vbroadcastss_avx512vl(auVar24);
          auVar31 = vbroadcastss_avx512vl(auVar39);
          auVar32 = vshufps_avx512vl(auVar39,auVar39,0x55);
          auVar33 = vshufps_avx512vl(auVar39,auVar39,0xaa);
          auVar25 = vbroadcastss_avx512vl(auVar25);
          auVar85._4_4_ = uVar83;
          auVar85._0_4_ = uVar83;
          auVar85._8_4_ = uVar83;
          auVar85._12_4_ = uVar83;
          auVar38 = vshufps_avx(auVar37,auVar37,0x55);
          auVar39 = vshufps_avx(auVar37,auVar37,0xaa);
          auVar26 = vbroadcastss_avx512vl(auVar26);
          uVar83 = auVar84._0_4_;
          auVar36._4_4_ = uVar83;
          auVar36._0_4_ = uVar83;
          auVar36._8_4_ = uVar83;
          auVar36._12_4_ = uVar83;
          auVar37 = vshufps_avx(auVar84,auVar84,0x55);
          auVar81 = auVar82._0_16_;
          auVar40 = vmovdqa64_avx512vl(auVar86._0_32_);
          auVar34 = vshufps_avx512vl(auVar84,auVar84,0xaa);
          auVar35 = vbroadcastss_avx512vl(auVar27);
          auVar36 = vmulps_avx512vl(auVar36,bezier_basis0._3740_16_);
          auVar37 = vmulps_avx512vl(auVar37,bezier_basis0._3740_16_);
          auVar34 = vmulps_avx512vl(auVar34,bezier_basis0._3740_16_);
          auVar35 = vmulps_avx512vl(auVar35,bezier_basis0._3740_16_);
          auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._2584_16_,auVar85);
          auVar38 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._2584_16_,auVar38);
          auVar39 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._2584_16_,auVar39);
          auVar37 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._2584_16_,auVar26);
          auVar26 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._1428_16_,auVar31);
          auVar38 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._1428_16_,auVar32);
          auVar39 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._1428_16_,auVar33);
          auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._1428_16_,auVar25);
          auVar25 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._272_16_,auVar28);
          auVar26 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._272_16_,auVar29);
          auVar28 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._272_16_,auVar30);
          auVar29 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._272_16_,auVar24);
          auVar37 = vshufps_avx(auVar25,auVar25,0xb1);
          auVar38 = vminps_avx(auVar37,auVar25);
          auVar39 = vshufpd_avx(auVar38,auVar38,1);
          auVar38 = vminps_avx(auVar39,auVar38);
          auVar24 = vshufps_avx(auVar26,auVar26,0xb1);
          auVar39 = vminps_avx512vl(auVar24,auVar26);
          auVar30 = vshufpd_avx512vl(auVar39,auVar39,1);
          auVar39 = vminps_avx512vl(auVar30,auVar39);
          auVar38 = vinsertps_avx512f(auVar38,auVar39,0x1c);
          auVar30 = vshufps_avx512vl(auVar28,auVar28,0xb1);
          auVar39 = vminps_avx512vl(auVar30,auVar28);
          auVar31 = vshufpd_avx512vl(auVar39,auVar39,1);
          auVar39 = vminps_avx512vl(auVar31,auVar39);
          auVar38 = vinsertps_avx512f(auVar38,auVar39,0x20);
          auVar39 = vmaxps_avx(auVar37,auVar25);
          auVar37 = vshufpd_avx(auVar39,auVar39,1);
          auVar39 = vmaxps_avx(auVar37,auVar39);
          auVar37 = vmaxps_avx(auVar24,auVar26);
          auVar24 = vshufpd_avx(auVar37,auVar37,1);
          auVar37 = vmaxps_avx(auVar24,auVar37);
          auVar39 = vinsertps_avx(auVar39,auVar37,0x1c);
          auVar24 = vmaxps_avx512vl(auVar30,auVar28);
          auVar40 = vmovdqa64_avx512vl(auVar40);
          auVar86 = ZEXT3264(auVar40);
          auVar71 = ZEXT3264(auVar71._0_32_);
          auVar82 = ZEXT1664(auVar81);
          auVar37 = vshufpd_avx(auVar24,auVar24,1);
          auVar37 = vmaxps_avx(auVar37,auVar24);
          auVar37 = vinsertps_avx512f(auVar39,auVar37,0x20);
          auVar39 = vandps_avx(auVar29,auVar81);
          auVar24 = vprolq_avx512vl(auVar39,0x20);
          auVar39 = vmaxps_avx(auVar24,auVar39);
          uVar83 = auVar39._0_4_;
          auVar24._4_4_ = uVar83;
          auVar24._0_4_ = uVar83;
          auVar24._8_4_ = uVar83;
          auVar24._12_4_ = uVar83;
          auVar39 = vshufps_avx(auVar39,auVar39,0xaa);
          auVar39 = vmaxps_avx512vl(auVar39,auVar24);
        }
        else {
          if ((int)uVar2 < 1) {
            auVar38 = vxorps_avx512vl(auVar26,auVar26);
            auVar64 = ZEXT1632(auVar38);
            auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar40 = auVar67;
            auVar65 = auVar67;
            auVar62 = auVar66;
            auVar63 = auVar66;
          }
          else {
            auVar41 = vpbroadcastd_avx512vl();
            auVar42 = vbroadcastss_avx512vl(auVar38);
            auVar56._8_4_ = 1;
            auVar56._0_8_ = 0x100000001;
            auVar56._12_4_ = 1;
            auVar56._16_4_ = 1;
            auVar56._20_4_ = 1;
            auVar56._24_4_ = 1;
            auVar56._28_4_ = 1;
            auVar43 = vpermps_avx512vl(auVar56,ZEXT1632(auVar38));
            auVar57._8_4_ = 2;
            auVar57._0_8_ = 0x200000002;
            auVar57._12_4_ = 2;
            auVar57._16_4_ = 2;
            auVar57._20_4_ = 2;
            auVar57._24_4_ = 2;
            auVar57._28_4_ = 2;
            auVar44 = vpermps_avx512vl(auVar57,ZEXT1632(auVar38));
            auVar45 = vbroadcastss_avx512vl(auVar24);
            auVar46 = vbroadcastss_avx512vl(auVar39);
            auVar47 = vpermps_avx512vl(auVar56,ZEXT1632(auVar39));
            auVar48 = vpermps_avx512vl(auVar57,ZEXT1632(auVar39));
            auVar49 = vbroadcastss_avx512vl(auVar25);
            auVar68 = vpermps_avx2(auVar56,ZEXT1632(auVar37));
            auVar50 = vpermps_avx512vl(auVar57,ZEXT1632(auVar37));
            auVar51 = vbroadcastss_avx512vl(auVar26);
            auVar52 = vbroadcastss_avx512vl(auVar84);
            auVar53 = vpermps_avx512vl(auVar56,ZEXT1632(auVar84));
            auVar54 = vpermps_avx512vl(auVar57,ZEXT1632(auVar84));
            auVar55 = vbroadcastss_avx512vl(auVar27);
            lVar17 = uVar20 * 0x44;
            auVar38 = vxorps_avx512vl(auVar26,auVar26);
            auVar87 = ZEXT1664(auVar38);
            uVar23 = 0;
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar57 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar58 = auVar57;
            auVar59 = auVar56;
            auVar60 = auVar56;
            auVar61 = auVar57;
            do {
              auVar40 = vpbroadcastd_avx512vl();
              auVar40 = vpord_avx512vl(auVar40,auVar86._0_32_);
              uVar12 = vpcmpgtd_avx512vl(auVar41,auVar40);
              auVar40 = *(undefined1 (*) [32])(lVar17 + 0x21aabec + uVar23 * 4);
              auVar65 = *(undefined1 (*) [32])(lVar17 + 0x21ab070 + uVar23 * 4);
              auVar62 = vmulps_avx512vl(auVar52,auVar65);
              auVar63 = vmulps_avx512vl(auVar53,auVar65);
              auVar64 = vmulps_avx512vl(auVar54,auVar65);
              auVar65 = vmulps_avx512vl(auVar55,auVar65);
              auVar13._4_4_ = uVar83;
              auVar13._0_4_ = uVar83;
              auVar13._8_4_ = uVar83;
              auVar13._12_4_ = uVar83;
              auVar13._16_4_ = uVar83;
              auVar13._20_4_ = uVar83;
              auVar13._24_4_ = uVar83;
              auVar13._28_4_ = uVar83;
              auVar38 = vfmadd231ps_fma(auVar62,auVar40,auVar13);
              auVar39 = vfmadd231ps_fma(auVar63,auVar40,auVar68);
              auVar62 = vfmadd231ps_avx512vl(auVar64,auVar40,auVar50);
              auVar65 = vfmadd231ps_avx512vl(auVar65,auVar51,auVar40);
              auVar40 = *(undefined1 (*) [32])(lVar17 + 0x21aa768 + uVar23 * 4);
              auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar40,auVar46);
              auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar40,auVar47);
              auVar37 = vfmadd231ps_fma(auVar62,auVar40,auVar48);
              auVar24 = vfmadd231ps_fma(auVar65,auVar40,auVar49);
              auVar40 = *(undefined1 (*) [32])(bezier_basis0 + uVar23 * 4 + lVar17);
              auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar40,auVar42);
              auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar40,auVar43);
              auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar40,auVar44);
              auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar40,auVar45);
              auVar40 = vminps_avx512vl(auVar59,ZEXT1632(auVar38));
              bVar6 = (byte)uVar12;
              auVar67._0_4_ =
                   (uint)(bVar6 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar59._0_4_;
              bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
              auVar67._4_4_ = (uint)bVar7 * auVar40._4_4_ | (uint)!bVar7 * auVar59._4_4_;
              bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
              auVar67._8_4_ = (uint)bVar7 * auVar40._8_4_ | (uint)!bVar7 * auVar59._8_4_;
              bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
              auVar67._12_4_ = (uint)bVar7 * auVar40._12_4_ | (uint)!bVar7 * auVar59._12_4_;
              bVar7 = (bool)((byte)(uVar12 >> 4) & 1);
              auVar67._16_4_ = (uint)bVar7 * auVar40._16_4_ | (uint)!bVar7 * auVar59._16_4_;
              bVar7 = (bool)((byte)(uVar12 >> 5) & 1);
              auVar67._20_4_ = (uint)bVar7 * auVar40._20_4_ | (uint)!bVar7 * auVar59._20_4_;
              bVar7 = (bool)((byte)(uVar12 >> 6) & 1);
              auVar67._24_4_ = (uint)bVar7 * auVar40._24_4_ | (uint)!bVar7 * auVar59._24_4_;
              bVar7 = SUB81(uVar12 >> 7,0);
              auVar67._28_4_ = (uint)bVar7 * auVar40._28_4_ | (uint)!bVar7 * auVar59._28_4_;
              auVar40 = vmaxps_avx512vl(auVar61,ZEXT1632(auVar38));
              auVar63._0_4_ =
                   (uint)(bVar6 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar61._0_4_;
              bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
              auVar63._4_4_ = (uint)bVar7 * auVar40._4_4_ | (uint)!bVar7 * auVar61._4_4_;
              bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
              auVar63._8_4_ = (uint)bVar7 * auVar40._8_4_ | (uint)!bVar7 * auVar61._8_4_;
              bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
              auVar63._12_4_ = (uint)bVar7 * auVar40._12_4_ | (uint)!bVar7 * auVar61._12_4_;
              bVar7 = (bool)((byte)(uVar12 >> 4) & 1);
              auVar63._16_4_ = (uint)bVar7 * auVar40._16_4_ | (uint)!bVar7 * auVar61._16_4_;
              bVar7 = (bool)((byte)(uVar12 >> 5) & 1);
              auVar63._20_4_ = (uint)bVar7 * auVar40._20_4_ | (uint)!bVar7 * auVar61._20_4_;
              bVar7 = (bool)((byte)(uVar12 >> 6) & 1);
              auVar63._24_4_ = (uint)bVar7 * auVar40._24_4_ | (uint)!bVar7 * auVar61._24_4_;
              bVar7 = SUB81(uVar12 >> 7,0);
              auVar63._28_4_ = (uint)bVar7 * auVar40._28_4_ | (uint)!bVar7 * auVar61._28_4_;
              auVar65 = vminps_avx512vl(auVar56,ZEXT1632(auVar39));
              auVar40._0_4_ =
                   (uint)(bVar6 & 1) * auVar65._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar56._0_4_;
              bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
              auVar40._4_4_ = (uint)bVar7 * auVar65._4_4_ | (uint)!bVar7 * auVar56._4_4_;
              bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
              auVar40._8_4_ = (uint)bVar7 * auVar65._8_4_ | (uint)!bVar7 * auVar56._8_4_;
              bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
              auVar40._12_4_ = (uint)bVar7 * auVar65._12_4_ | (uint)!bVar7 * auVar56._12_4_;
              bVar7 = (bool)((byte)(uVar12 >> 4) & 1);
              auVar40._16_4_ = (uint)bVar7 * auVar65._16_4_ | (uint)!bVar7 * auVar56._16_4_;
              bVar7 = (bool)((byte)(uVar12 >> 5) & 1);
              auVar40._20_4_ = (uint)bVar7 * auVar65._20_4_ | (uint)!bVar7 * auVar56._20_4_;
              bVar7 = (bool)((byte)(uVar12 >> 6) & 1);
              auVar40._24_4_ = (uint)bVar7 * auVar65._24_4_ | (uint)!bVar7 * auVar56._24_4_;
              bVar7 = SUB81(uVar12 >> 7,0);
              auVar40._28_4_ = (uint)bVar7 * auVar65._28_4_ | (uint)!bVar7 * auVar56._28_4_;
              auVar65 = vmaxps_avx512vl(auVar58,ZEXT1632(auVar39));
              auVar66._0_4_ =
                   (uint)(bVar6 & 1) * auVar65._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar58._0_4_;
              bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
              auVar66._4_4_ = (uint)bVar7 * auVar65._4_4_ | (uint)!bVar7 * auVar58._4_4_;
              bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
              auVar66._8_4_ = (uint)bVar7 * auVar65._8_4_ | (uint)!bVar7 * auVar58._8_4_;
              bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
              auVar66._12_4_ = (uint)bVar7 * auVar65._12_4_ | (uint)!bVar7 * auVar58._12_4_;
              bVar7 = (bool)((byte)(uVar12 >> 4) & 1);
              auVar66._16_4_ = (uint)bVar7 * auVar65._16_4_ | (uint)!bVar7 * auVar58._16_4_;
              bVar7 = (bool)((byte)(uVar12 >> 5) & 1);
              auVar66._20_4_ = (uint)bVar7 * auVar65._20_4_ | (uint)!bVar7 * auVar58._20_4_;
              bVar7 = (bool)((byte)(uVar12 >> 6) & 1);
              auVar66._24_4_ = (uint)bVar7 * auVar65._24_4_ | (uint)!bVar7 * auVar58._24_4_;
              bVar7 = SUB81(uVar12 >> 7,0);
              auVar66._28_4_ = (uint)bVar7 * auVar65._28_4_ | (uint)!bVar7 * auVar58._28_4_;
              auVar62 = vminps_avx512vl(auVar60,ZEXT1632(auVar37));
              auVar65._0_4_ =
                   (uint)(bVar6 & 1) * auVar62._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar60._0_4_;
              bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
              auVar65._4_4_ = (uint)bVar7 * auVar62._4_4_ | (uint)!bVar7 * auVar60._4_4_;
              bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
              auVar65._8_4_ = (uint)bVar7 * auVar62._8_4_ | (uint)!bVar7 * auVar60._8_4_;
              bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
              auVar65._12_4_ = (uint)bVar7 * auVar62._12_4_ | (uint)!bVar7 * auVar60._12_4_;
              bVar7 = (bool)((byte)(uVar12 >> 4) & 1);
              auVar65._16_4_ = (uint)bVar7 * auVar62._16_4_ | (uint)!bVar7 * auVar60._16_4_;
              bVar7 = (bool)((byte)(uVar12 >> 5) & 1);
              auVar65._20_4_ = (uint)bVar7 * auVar62._20_4_ | (uint)!bVar7 * auVar60._20_4_;
              bVar7 = (bool)((byte)(uVar12 >> 6) & 1);
              auVar65._24_4_ = (uint)bVar7 * auVar62._24_4_ | (uint)!bVar7 * auVar60._24_4_;
              bVar7 = SUB81(uVar12 >> 7,0);
              auVar65._28_4_ = (uint)bVar7 * auVar62._28_4_ | (uint)!bVar7 * auVar60._28_4_;
              auVar64 = vmaxps_avx512vl(auVar57,ZEXT1632(auVar37));
              auVar62._0_4_ =
                   (uint)(bVar6 & 1) * auVar64._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar57._0_4_;
              bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
              auVar62._4_4_ = (uint)bVar7 * auVar64._4_4_ | (uint)!bVar7 * auVar57._4_4_;
              bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
              auVar62._8_4_ = (uint)bVar7 * auVar64._8_4_ | (uint)!bVar7 * auVar57._8_4_;
              bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
              auVar62._12_4_ = (uint)bVar7 * auVar64._12_4_ | (uint)!bVar7 * auVar57._12_4_;
              bVar7 = (bool)((byte)(uVar12 >> 4) & 1);
              auVar62._16_4_ = (uint)bVar7 * auVar64._16_4_ | (uint)!bVar7 * auVar57._16_4_;
              bVar7 = (bool)((byte)(uVar12 >> 5) & 1);
              auVar62._20_4_ = (uint)bVar7 * auVar64._20_4_ | (uint)!bVar7 * auVar57._20_4_;
              bVar7 = (bool)((byte)(uVar12 >> 6) & 1);
              auVar62._24_4_ = (uint)bVar7 * auVar64._24_4_ | (uint)!bVar7 * auVar57._24_4_;
              bVar7 = SUB81(uVar12 >> 7,0);
              auVar62._28_4_ = (uint)bVar7 * auVar64._28_4_ | (uint)!bVar7 * auVar57._28_4_;
              auVar64 = vandps_avx(ZEXT1632(auVar24),auVar71._0_32_);
              auVar56 = vmaxps_avx512vl(auVar87._0_32_,auVar64);
              auVar64._0_4_ =
                   (uint)(bVar6 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar87._0_4_;
              bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
              auVar64._4_4_ = (uint)bVar7 * auVar56._4_4_ | (uint)!bVar7 * auVar87._4_4_;
              bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
              auVar64._8_4_ = (uint)bVar7 * auVar56._8_4_ | (uint)!bVar7 * auVar87._8_4_;
              bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
              auVar64._12_4_ = (uint)bVar7 * auVar56._12_4_ | (uint)!bVar7 * auVar87._12_4_;
              bVar7 = (bool)((byte)(uVar12 >> 4) & 1);
              auVar64._16_4_ = (uint)bVar7 * auVar56._16_4_ | (uint)!bVar7 * auVar87._16_4_;
              bVar7 = (bool)((byte)(uVar12 >> 5) & 1);
              auVar64._20_4_ = (uint)bVar7 * auVar56._20_4_ | (uint)!bVar7 * auVar87._20_4_;
              bVar7 = (bool)((byte)(uVar12 >> 6) & 1);
              auVar64._24_4_ = (uint)bVar7 * auVar56._24_4_ | (uint)!bVar7 * auVar87._24_4_;
              bVar7 = SUB81(uVar12 >> 7,0);
              auVar64._28_4_ = (uint)bVar7 * auVar56._28_4_ | (uint)!bVar7 * auVar87._28_4_;
              auVar87 = ZEXT3264(auVar64);
              uVar23 = uVar23 + 8;
              auVar56 = auVar40;
              auVar57 = auVar62;
              auVar58 = auVar66;
              auVar59 = auVar67;
              auVar60 = auVar65;
              auVar61 = auVar63;
            } while (uVar23 < uVar20);
          }
          auVar68 = vshufps_avx512vl(auVar67,auVar67,0xb1);
          auVar68 = vminps_avx512vl(auVar67,auVar68);
          auVar67 = vshufpd_avx(auVar68,auVar68,5);
          auVar67 = vminps_avx(auVar68,auVar67);
          auVar38 = vminps_avx(auVar67._0_16_,auVar67._16_16_);
          auVar67 = vshufps_avx(auVar40,auVar40,0xb1);
          auVar40 = vminps_avx(auVar40,auVar67);
          auVar67 = vshufpd_avx(auVar40,auVar40,5);
          auVar40 = vminps_avx(auVar40,auVar67);
          auVar39 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
          auVar39 = vunpcklps_avx(auVar38,auVar39);
          auVar40 = vshufps_avx512vl(auVar65,auVar65,0xb1);
          auVar65 = vminps_avx512vl(auVar65,auVar40);
          auVar40 = vshufpd_avx(auVar65,auVar65,5);
          auVar40 = vminps_avx(auVar65,auVar40);
          auVar38 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
          auVar38 = vinsertps_avx(auVar39,auVar38,0x28);
          auVar40 = vshufps_avx512vl(auVar63,auVar63,0xb1);
          auVar65 = vmaxps_avx512vl(auVar63,auVar40);
          auVar40 = vshufpd_avx(auVar65,auVar65,5);
          auVar40 = vmaxps_avx(auVar65,auVar40);
          auVar39 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
          auVar40 = vshufps_avx512vl(auVar66,auVar66,0xb1);
          auVar65 = vmaxps_avx512vl(auVar66,auVar40);
          auVar40 = vshufpd_avx(auVar65,auVar65,5);
          auVar40 = vmaxps_avx(auVar65,auVar40);
          auVar37 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
          auVar37 = vunpcklps_avx(auVar39,auVar37);
          auVar40 = vshufps_avx512vl(auVar62,auVar62,0xb1);
          auVar65 = vmaxps_avx512vl(auVar62,auVar40);
          auVar40 = vshufpd_avx(auVar65,auVar65,5);
          auVar40 = vmaxps_avx(auVar65,auVar40);
          auVar39 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
          auVar37 = vinsertps_avx512f(auVar37,auVar39,0x28);
          auVar40 = vshufps_avx512vl(auVar64,auVar64,0xb1);
          auVar65 = vmaxps_avx512vl(auVar64,auVar40);
          auVar40 = vshufpd_avx(auVar65,auVar65,5);
          auVar40 = vmaxps_avx(auVar65,auVar40);
          auVar39 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
          auVar39 = vbroadcastss_avx512vl(auVar39);
        }
        auVar24 = vinsertps_avx512f(auVar84,auVar27,0x30);
        auVar84 = vminps_avx(auVar38,auVar24);
        auVar24 = vmaxps_avx512vl(auVar37,auVar24);
        auVar38 = vbroadcastss_avx512vl(auVar27);
        auVar25 = auVar82._0_16_;
        auVar38 = vandps_avx(auVar38,auVar25);
        auVar38 = vmaxps_avx512vl(auVar39,auVar38);
        auVar37 = vsubps_avx(auVar84,auVar38);
        auVar84._0_4_ = auVar24._0_4_ + auVar38._0_4_;
        auVar84._4_4_ = auVar24._4_4_ + auVar38._4_4_;
        auVar84._8_4_ = auVar24._8_4_ + auVar38._8_4_;
        auVar84._12_4_ = auVar24._12_4_ + auVar38._12_4_;
        auVar38 = vandps_avx(auVar37,auVar25);
        auVar39 = vandps_avx(auVar84,auVar25);
        auVar38 = vmaxps_avx(auVar38,auVar39);
        auVar39 = vmovshdup_avx(auVar38);
        auVar39 = vmaxss_avx(auVar39,auVar38);
        auVar38 = vshufpd_avx(auVar38,auVar38,1);
        auVar38 = vmaxss_avx(auVar38,auVar39);
        fVar1 = auVar38._0_4_ * 4.7683716e-07;
        auVar25._4_4_ = fVar1;
        auVar25._0_4_ = fVar1;
        auVar25._8_4_ = fVar1;
        auVar25._12_4_ = fVar1;
        auVar38 = vsubps_avx(auVar37,auVar25);
        aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar38,ZEXT416(geomID),0x30);
        auVar37._0_4_ = auVar84._0_4_ + fVar1;
        auVar37._4_4_ = auVar84._4_4_ + fVar1;
        auVar37._8_4_ = auVar84._8_4_ + fVar1;
        auVar37._12_4_ = auVar84._12_4_ + fVar1;
        aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar37,ZEXT416((uint)uVar18),0x30);
        auVar38 = vminps_avx(auVar70._0_16_,(undefined1  [16])aVar8);
        auVar70 = ZEXT1664(auVar38);
        auVar38 = vmaxps_avx(auVar69._0_16_,(undefined1  [16])aVar9);
        auVar69 = ZEXT1664(auVar38);
        auVar26._0_4_ = aVar8.x + aVar9.x;
        auVar26._4_4_ = aVar8.y + aVar9.y;
        auVar26._8_4_ = aVar8.z + aVar9.z;
        auVar26._12_4_ = aVar8.field_3.w + aVar9.field_3.w;
        auVar38 = vminps_avx(auVar75._0_16_,auVar26);
        auVar75 = ZEXT1664(auVar38);
        auVar38 = vmaxps_avx(auVar78._0_16_,auVar26);
        auVar78 = ZEXT1664(auVar38);
        local_1b0 = local_1b0 + 1;
        prims[local_1a8].upper.field_0.field_1 = aVar9;
        prims[local_1a8].lower.field_0.field_1 = aVar8;
        uVar16 = r->_end;
        local_1a8 = local_1a8 + 1;
      }
LAB_01ecae64:
      aVar76 = auVar78._0_16_;
      aVar73 = auVar75._0_16_;
      aVar77 = auVar69._0_16_;
      aVar74 = auVar70._0_16_;
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar16);
  }
  else {
    aVar74.m128[2] = INFINITY;
    aVar74._0_8_ = 0x7f8000007f800000;
    aVar74.m128[3] = INFINITY;
    aVar77.m128[2] = -INFINITY;
    aVar77._0_8_ = 0xff800000ff800000;
    aVar77.m128[3] = -INFINITY;
    local_1b0 = 0;
    aVar73 = aVar74;
    aVar76 = aVar77;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar74;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar77;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar73;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar76;
  __return_storage_ptr__->end = local_1b0;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }